

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_scaling.c
# Opt level: O2

cupdlp_retcode
cupdlp_l2norm_scaling
          (CUPDLPcsc *csc,cupdlp_float *cost,cupdlp_float *lower,cupdlp_float *upper,
          cupdlp_float *rhs,CUPDLPscaling *scaling)

{
  int len;
  uint len_00;
  int iVar1;
  cupdlp_int *pcVar2;
  cupdlp_float *col_scaling;
  cupdlp_float *row_scaling;
  ulong uVar3;
  int i;
  cupdlp_retcode cVar4;
  ulong uVar5;
  size_t sVar6;
  double dVar7;
  cupdlp_float cVar8;
  
  len = csc->nRows;
  len_00 = csc->nCols;
  col_scaling = (cupdlp_float *)calloc((long)(int)len_00,8);
  cVar4 = 1;
  if ((col_scaling == (cupdlp_float *)0x0) ||
     (row_scaling = (cupdlp_float *)calloc((long)len,8), row_scaling == (cupdlp_float *)0x0)) {
    row_scaling = (cupdlp_float *)0x0;
  }
  else {
    if (0 < len) {
      uVar5 = 0;
      uVar3 = 0;
      if (0 < (int)len_00) {
        uVar3 = (ulong)len_00;
      }
      for (; pcVar2 = csc->colMatBeg, uVar3 != uVar5; uVar5 = uVar5 + 1) {
        iVar1 = pcVar2[uVar5];
        cVar8 = 1.0;
        if (pcVar2[uVar5 + 1] != iVar1) {
          dVar7 = GenNorm(csc->colMatElem + iVar1,pcVar2[uVar5 + 1] - iVar1,2.0);
          if (dVar7 < 0.0) {
            cVar8 = sqrt(dVar7);
          }
          else {
            cVar8 = SQRT(dVar7);
          }
        }
        col_scaling[uVar5] = cVar8;
      }
      uVar5 = 0;
      uVar3 = (ulong)(uint)pcVar2[(int)len_00];
      if (pcVar2[(int)len_00] < 1) {
        uVar3 = uVar5;
      }
      for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
        row_scaling[csc->colMatIdx[uVar5]] =
             csc->colMatElem[uVar5] * csc->colMatElem[uVar5] + row_scaling[csc->colMatIdx[uVar5]];
      }
      for (sVar6 = 0; (long)len != sVar6; sVar6 = sVar6 + 1) {
        dVar7 = row_scaling[sVar6];
        if (dVar7 < 0.0) {
          dVar7 = sqrt(dVar7);
        }
        else {
          dVar7 = SQRT(dVar7);
        }
        if (dVar7 < 0.0) {
          dVar7 = sqrt(dVar7);
        }
        else {
          dVar7 = SQRT(dVar7);
        }
        row_scaling[sVar6] =
             (cupdlp_float)
             (~-(ulong)(dVar7 == 0.0) & (ulong)dVar7 | -(ulong)(dVar7 == 0.0) & 0x3ff0000000000000);
      }
    }
    scale_problem(csc,cost,lower,upper,rhs,col_scaling,row_scaling);
    cupdlp_cdot(scaling->colScale,col_scaling,len_00);
    cupdlp_cdot(scaling->rowScale,row_scaling,len);
    cVar4 = 0;
  }
  free(col_scaling);
  free(row_scaling);
  return cVar4;
}

Assistant:

cupdlp_retcode cupdlp_l2norm_scaling(CUPDLPcsc *csc, cupdlp_float *cost,
                                     cupdlp_float *lower,
                                     cupdlp_float *upper,
                                     cupdlp_float *rhs,
                                     CUPDLPscaling *scaling)
// cupdlp_retcode cupdlp_l2norm_scaling(CUPDLPwork *work)
{
  cupdlp_retcode retcode = RETCODE_OK;
  cupdlp_int nRows = csc->nRows;
  cupdlp_int nCols = csc->nCols;

  cupdlp_float *current_col_scaling = NULL;  // for variable
  cupdlp_float *current_row_scaling = NULL;  // for constraint
  CUPDLP_INIT_ZERO_DOUBLE(current_col_scaling, nCols);
  CUPDLP_INIT_ZERO_DOUBLE(current_row_scaling, nRows);

  if (nRows > 0) {
    for (int j = 0; j < nCols; j++) {
      if (csc->colMatBeg[j] == csc->colMatBeg[j + 1]) {
        current_col_scaling[j] = 1.0;
      } else {
        current_col_scaling[j] =
            SQRTF(GenNorm(&csc->colMatElem[csc->colMatBeg[j]],
                          csc->colMatBeg[j + 1] - csc->colMatBeg[j], 2.0));
      }
    }

    for (int i = 0; i < csc->colMatBeg[nCols]; i++) {
      current_row_scaling[csc->colMatIdx[i]] += pow(csc->colMatElem[i], 2.0);
    }
    for (int i = 0; i < nRows; i++) {
      current_row_scaling[i] = SQRTF(SQRTF(current_row_scaling[i]));
      if (current_row_scaling[i] == 0.0) {
        current_row_scaling[i] = 1.0;
      }
    }
  }
  // apply scaling
  // scale_problem(work, current_col_scaling, current_row_scaling);
  scale_problem(csc, cost, lower, upper, rhs, current_col_scaling,
                current_row_scaling);

  // update scaling
  cupdlp_cdot(scaling->colScale, current_col_scaling, nCols);
  cupdlp_cdot(scaling->rowScale, current_row_scaling, nRows);

exit_cleanup:
  cupdlp_free(current_col_scaling);
  cupdlp_free(current_row_scaling);
  return retcode;
}